

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void db_compact_overwrite(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  char *__format;
  fdb_doc *pfVar7;
  fdb_doc *pfVar8;
  long lVar9;
  fdb_doc *rdoc;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile2;
  fdb_file_handle *dbfile;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_doc *local_788;
  fdb_kvs_handle *local_780;
  fdb_kvs_handle *local_778;
  fdb_file_handle *local_770;
  fdb_file_handle *local_768;
  fdb_kvs_config local_760;
  fdb_kvs_info local_748;
  timeval local_718;
  fdb_doc *apfStack_708 [30];
  fdb_doc *apfStack_618 [61];
  fdb_config local_430;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_718,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_430.buffercache_size = 0x1000000;
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  fdb_open(&local_768,"./compact_test1",&local_430);
  fdb_kvs_open(local_768,&local_778,(char *)0x0,&local_760);
  fVar1 = fdb_set_log_callback(local_778,logCallbackFunc,"db_destroy_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x548);
    db_compact_overwrite()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x548,"void db_compact_overwrite()");
  }
  lVar9 = 0;
  for (uVar6 = 0; uVar6 != 0x1e; uVar6 = uVar6 + 1) {
    sprintf(local_238,"key%d",uVar6 & 0xffffffff);
    sprintf(local_338,"meta%d",uVar6 & 0xffffffff);
    sprintf(local_138,"body%d",uVar6 & 0xffffffff);
    sVar3 = strlen(local_238);
    sVar4 = strlen(local_338);
    sVar5 = strlen(local_138);
    fdb_doc_create((fdb_doc **)((long)apfStack_708 + lVar9),local_238,sVar3,local_338,sVar4,
                   local_138,sVar5);
    fdb_set(local_778,apfStack_708[uVar6]);
    lVar9 = lVar9 + 8;
  }
  fdb_commit(local_768,'\0');
  fdb_open(&local_770,"./compact_test1.1",&local_430);
  fdb_kvs_open(local_770,&local_780,(char *)0x0,&local_760);
  fVar1 = fdb_set_log_callback(local_780,logCallbackFunc,"db_destroy_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x558);
    db_compact_overwrite()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x558,"void db_compact_overwrite()");
  }
  lVar9 = 0;
  for (uVar6 = 0; uVar6 != 0x3c; uVar6 = uVar6 + 1) {
    sprintf(local_238,"k2ey%d",uVar6 & 0xffffffff);
    sprintf(local_338,"m2eta%d",uVar6 & 0xffffffff);
    sprintf(local_138,"b2ody%d",uVar6 & 0xffffffff);
    sVar3 = strlen(local_238);
    sVar4 = strlen(local_338);
    sVar5 = strlen(local_138);
    fdb_doc_create((fdb_doc **)((long)apfStack_618 + lVar9),local_238,sVar3,local_338,sVar4,
                   local_138,sVar5);
    fdb_set(local_780,apfStack_618[uVar6]);
    lVar9 = lVar9 + 8;
  }
  fdb_commit(local_770,'\0');
  fdb_get_kvs_info(local_780,&local_748);
  if (local_748.last_seqnum != 0x3c) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x567);
    db_compact_overwrite()::__test_pass = '\x01';
    if (local_748.last_seqnum != 0x3c) {
      __assert_fail("kvs_info.last_seqnum == (uint64_t)2*n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x567,"void db_compact_overwrite()");
    }
  }
  fdb_kvs_close(local_780);
  fdb_close(local_770);
  fVar1 = fdb_compact(local_768,(char *)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_kvs_close(local_778);
    fdb_close(local_768);
    fdb_open(&local_768,"./compact_test1",&local_430);
    fdb_kvs_open(local_768,&local_778,(char *)0x0,&local_760);
    fVar1 = fdb_set_log_callback(local_778,logCallbackFunc,"db_destroy_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x578);
      db_compact_overwrite()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x578,"void db_compact_overwrite()");
    }
    lVar9 = 0;
    while( true ) {
      if (lVar9 == 0x1e) {
        fdb_open(&local_770,"./compact_test1.1",&local_430);
        fdb_kvs_open(local_770,&local_780,(char *)0x0,&local_760);
        fVar1 = fdb_set_log_callback(local_780,logCallbackFunc,"db_destroy_test");
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x58a);
          db_compact_overwrite()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x58a,"void db_compact_overwrite()");
        }
        fdb_get_kvs_info(local_780,&local_748);
        if (local_748.last_seqnum != 0x3c) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                 );
          db_compact_overwrite()::__test_pass = '\x01';
          if (local_748.last_seqnum != 0x3c) {
            __assert_fail("kvs_info.last_seqnum == (uint64_t)2*n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x58d,"void db_compact_overwrite()");
          }
        }
        lVar9 = 0;
        while( true ) {
          if (lVar9 == 0x3c) {
            for (lVar9 = 0; lVar9 != 0x1e; lVar9 = lVar9 + 1) {
              fdb_doc_free(apfStack_708[lVar9]);
              fdb_doc_free(apfStack_618[lVar9]);
            }
            for (lVar9 = 0; lVar9 != 0x1e; lVar9 = lVar9 + 1) {
              fdb_doc_free(apfStack_618[lVar9 + 0x1e]);
            }
            fdb_kvs_close(local_778);
            fdb_close(local_768);
            fdb_kvs_close(local_780);
            fdb_close(local_770);
            fdb_shutdown();
            memleak_end();
            __format = "%s PASSED\n";
            if (db_compact_overwrite()::__test_pass != '\0') {
              __format = "%s FAILED\n";
            }
            fprintf(_stderr,__format,"compact overwrite");
            return;
          }
          fdb_doc_create(&local_788,apfStack_618[lVar9]->key,apfStack_618[lVar9]->keylen,(void *)0x0
                         ,0,(void *)0x0,0);
          fVar1 = fdb_get(local_780,local_788);
          pfVar7 = local_788;
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pfVar8 = apfStack_618[lVar9];
          iVar2 = bcmp(local_788->meta,pfVar8->meta,local_788->metalen);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                   );
            pfVar7 = local_788;
            db_compact_overwrite()::__test_pass = '\x01';
            pfVar8 = apfStack_618[lVar9];
            iVar2 = bcmp(local_788->meta,pfVar8->meta,local_788->metalen);
            if (iVar2 != 0) {
              __assert_fail("!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x595,"void db_compact_overwrite()");
            }
          }
          iVar2 = bcmp(pfVar7->body,pfVar8->body,pfVar7->bodylen);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                   );
            pfVar7 = local_788;
            db_compact_overwrite()::__test_pass = '\x01';
            iVar2 = bcmp(local_788->body,apfStack_618[lVar9]->body,local_788->bodylen);
            if (iVar2 != 0) {
              __assert_fail("!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x596,"void db_compact_overwrite()");
            }
          }
          fdb_doc_free(pfVar7);
          lVar9 = lVar9 + 1;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x594);
        db_compact_overwrite()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x594,"void db_compact_overwrite()");
      }
      fdb_doc_create(&local_788,apfStack_708[lVar9]->key,apfStack_708[lVar9]->keylen,(void *)0x0,0,
                     (void *)0x0,0);
      fVar1 = fdb_get(local_778,local_788);
      pfVar7 = local_788;
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      pfVar8 = apfStack_708[lVar9];
      iVar2 = bcmp(local_788->meta,pfVar8->meta,local_788->metalen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
               );
        pfVar7 = local_788;
        db_compact_overwrite()::__test_pass = '\x01';
        pfVar8 = apfStack_708[lVar9];
        iVar2 = bcmp(local_788->meta,pfVar8->meta,local_788->metalen);
        if (iVar2 != 0) {
          __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x57f,"void db_compact_overwrite()");
        }
      }
      iVar2 = bcmp(pfVar7->body,pfVar8->body,pfVar7->bodylen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
               );
        pfVar7 = local_788;
        db_compact_overwrite()::__test_pass = '\x01';
        iVar2 = bcmp(local_788->body,apfStack_708[lVar9]->body,local_788->bodylen);
        if (iVar2 != 0) {
          __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x580,"void db_compact_overwrite()");
        }
      }
      fdb_doc_free(pfVar7);
      lVar9 = lVar9 + 1;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x57e);
    db_compact_overwrite()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x57e,"void db_compact_overwrite()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x56d);
  db_compact_overwrite()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x56d,"void db_compact_overwrite()");
}

Assistant:

void db_compact_overwrite()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile2;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc **doc2 = alca(fdb_doc *, 2*n);
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_info kvs_info;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // write to db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Open the empty db with future compact name
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // write to db2
    for (i=0;i < 2*n;++i){
        sprintf(keybuf, "k2ey%d", i);
        sprintf(metabuf, "m2eta%d", i);
        sprintf(bodybuf, "b2ody%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc2[i]);
    }
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);


    // verify db2 seqnum and close
    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);

    // compact db1
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db1
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // read db1
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // reopen db2
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);

    // read db2
    for (i=0;i<2*n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc2[i]->key, doc2[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }
    for (i=n;i<2*n;++i){
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);


    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact overwrite");
}